

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

dtree_node_t * best_leaf_node(dtree_node_t *node)

{
  dtree_node_t *pdVar1;
  dtree_node_t *pdVar2;
  dtree_node_t *local_30;
  dtree_node_t *ret;
  dtree_node_t *cmp_n;
  dtree_node_t *cmp_y;
  dtree_node_t *node_local;
  
  if ((node->y != (dtree_node_str *)0x0) || (local_30 = node, node->n != (dtree_node_str *)0x0)) {
    pdVar1 = best_leaf_node(node->y);
    pdVar2 = best_leaf_node(node->n);
    if (((pdVar1 == (dtree_node_t *)0x0) || (pdVar1->q == (void *)0x0)) &&
       ((pdVar2 == (dtree_node_t *)0x0 || (pdVar2->q == (void *)0x0)))) {
      return (dtree_node_t *)0x0;
    }
    local_30 = pdVar2;
    if ((((pdVar1 != (dtree_node_t *)0x0) && (pdVar1->q != (void *)0x0)) &&
        (local_30 = pdVar1, pdVar2 != (dtree_node_t *)0x0)) &&
       ((pdVar2->q != (void *)0x0 &&
        (local_30 = pdVar2,
        (double)pdVar2->wt_ent_dec <= (double)pdVar1->wt_ent_dec &&
        (double)pdVar1->wt_ent_dec != (double)pdVar2->wt_ent_dec)))) {
      local_30 = pdVar1;
    }
  }
  return local_30;
}

Assistant:

dtree_node_t *
best_leaf_node(dtree_node_t *node)
{
    dtree_node_t *cmp_y, *cmp_n, *ret;

    ret = NULL;

    if (IS_LEAF(node)) {
	ret = node;
    }
    else {
	cmp_y = best_leaf_node(node->y);
	cmp_n = best_leaf_node(node->n);

	if ((cmp_y == NULL || cmp_y->q == NULL) &&
	    (cmp_n == NULL || cmp_n->q == NULL)) {
	    return NULL;
	}
	else if ((cmp_y == NULL) || (cmp_y->q == NULL)) {
	    ret = cmp_n;
	}
	else if ((cmp_n == NULL) || (cmp_n->q == NULL)) {
	    ret = cmp_y;
	}
	else if (cmp_y->wt_ent_dec > cmp_n->wt_ent_dec) {
	    ret = cmp_y;
	}
	else {
	    ret = cmp_n;
	}
    }

    return ret;
}